

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

command_result_status
bgp_command(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *command_params)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  size_t param_count;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *command_params_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(command_params);
  if (sVar2 < 2) {
    command_params_local._4_4_ = INVALID_PARAMS;
  }
  else {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](command_params,1);
    bVar1 = std::operator==(pvVar3,"route");
    if (bVar1) {
      command_params_local._4_4_ = bgp_route_command(command_params);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](command_params,1);
      bVar1 = std::operator==(pvVar3,"statistics");
      if (bVar1) {
        command_params_local._4_4_ = bgp_statistic_command();
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](command_params,1);
        bVar1 = std::operator==(pvVar3,"neighbor");
        if (bVar1) {
          command_params_local._4_4_ = bgp_neighbor_command(command_params);
        }
        else {
          command_params_local._4_4_ = INVALID_PARAMS;
        }
      }
    }
  }
  return command_params_local._4_4_;
}

Assistant:

command_result_status bgp_command(const std::vector<std::string>& command_params){
    size_t param_count = command_params.size();
    if(param_count < 2){
        return command_result_status::INVALID_PARAMS;
    }
    if(command_params[1] == "route"){ // bgp route
        return bgp_route_command(command_params);
    }else if(command_params[1] == "statistics"){ // bgp statistics
        return bgp_statistic_command();
    }else if(command_params[1] == "neighbor"){ // bgp neighbor
        return bgp_neighbor_command(command_params);
    }

    return command_result_status::INVALID_PARAMS;
}